

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void * xm_get_sample_waveform(xm_context_t *ctx,uint16_t i,uint16_t s,size_t *size,uint8_t *bits)

{
  xm_sample_t *pxVar1;
  xm_instrument_t *pxVar2;
  int iVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  ulong uVar5;
  
  iVar3 = (int)CONCAT62(in_register_00000032,i);
  uVar4 = CONCAT62(in_register_00000032,i) & 0xffffffff;
  if ((iVar3 == 0) || ((ctx->module).num_instruments < (ushort)uVar4)) {
    fprintf(_stderr,"%s(): invalid instrument %d\n","xm_get_sample_waveform",uVar4);
    fflush(_stderr);
  }
  pxVar2 = (ctx->module).instruments;
  uVar5 = (ulong)s;
  if (pxVar2[i].num_samples < s) {
    fprintf(_stderr,"%s(): invalid sample %d for instrument %d\n","xm_get_sample_waveform",uVar5,
            uVar4);
    fflush(_stderr);
    pxVar2 = (ctx->module).instruments;
  }
  iVar3 = iVar3 + -1;
  pxVar1 = pxVar2[iVar3].samples;
  *size = (ulong)pxVar1[uVar5].length;
  *bits = pxVar1[uVar5].bits;
  return (ctx->module).instruments[iVar3].samples[uVar5].field_11.data8;
}

Assistant:

void* xm_get_sample_waveform(xm_context_t* ctx, uint16_t i, uint16_t s, size_t* size, uint8_t* bits) {
	CHECK_SAMPLE(ctx, i, s);
	*size = ctx->module.instruments[i - 1].samples[s].length;
	*bits = ctx->module.instruments[i - 1].samples[s].bits;
	return ctx->module.instruments[i - 1].samples[s].data8;
}